

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PopFont(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  ImFont *font;
  
  pIVar2 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  iVar1 = (pIVar2->FontStack).Size;
  if (0 < iVar1) {
    uVar3 = iVar1 - 1;
    (pIVar2->FontStack).Size = uVar3;
    if (uVar3 == 0) {
      font = GetDefaultFont();
    }
    else {
      font = (pIVar2->FontStack).Data[(ulong)uVar3 - 1];
    }
    SetCurrentFont(font);
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4e1,"void ImVector<ImFont *>::pop_back() [T = ImFont *]");
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}